

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOutput.cpp
# Opt level: O3

error<idx2::err_code> idx2::WriteBuffer(cstr FileName,buffer *Buf)

{
  long lVar1;
  int iVar2;
  FILE *__s;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  char *pcVar7;
  long *in_FS_OFFSET;
  error<idx2::err_code> eVar8;
  
  __s = fopen(FileName,"wb");
  if (__s == (FILE *)0x0) {
    *(char **)(*in_FS_OFFSET + -0x400) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x32;
    lVar4 = -0x1f8;
    do {
      if (*(int *)((long)&mmap_err_code_s::NameMap.Arr[0].Name.field_0 + lVar4) == 10) {
        iVar2 = 10;
        goto LAB_0019bdea;
      }
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0);
    iVar2 = 0x15;
LAB_0019bdea:
    lVar4 = 0;
    do {
      if (*(int *)((long)&err_code_s::NameMap.Arr[0].ItemVal + lVar4) == iVar2) {
        uVar5 = 0x1000000000a;
        uVar6 = 0x32;
        goto LAB_0019be8a;
      }
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x1f8);
LAB_0019be43:
    __assert_fail("It != End(EnumS.NameMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/ErrorCodes.h"
                  ,0xc,"stref idx2::ToString(err_code)");
  }
  sVar3 = fwrite(Buf->Data,Buf->Bytes,1,__s);
  lVar4 = *in_FS_OFFSET;
  *(char **)(*in_FS_OFFSET + -0x400) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
  ;
  if (sVar3 == 1) {
    *(undefined4 *)(lVar4 + -0x200) = 0x37;
    pcVar7 = "";
    uVar5 = 0;
LAB_0019befa:
    fclose(__s);
LAB_0019bf02:
    eVar8.Code = (int)uVar5;
    eVar8.StackIdx = (char)((ulong)uVar5 >> 0x20);
    eVar8.StrGened = (bool)(char)((ulong)uVar5 >> 0x28);
    eVar8._14_2_ = (short)((ulong)uVar5 >> 0x30);
    eVar8.Msg = pcVar7;
    return eVar8;
  }
  *(undefined4 *)(lVar4 + -0x200) = 0x36;
  lVar4 = -0x1f8;
  do {
    if (*(int *)((long)&mmap_err_code_s::NameMap.Arr[0].Name.field_0 + lVar4) == 0xc) {
      iVar2 = 0xc;
      goto LAB_0019be2f;
    }
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0);
  iVar2 = 0x15;
LAB_0019be2f:
  lVar4 = 0;
LAB_0019be31:
  if (*(int *)((long)&err_code_s::NameMap.Arr[0].ItemVal + lVar4) != iVar2) goto code_r0x0019be37;
  uVar5 = 0x1000000000c;
  uVar6 = 0x36;
LAB_0019be8a:
  pcVar7 = "%s";
  lVar1 = *in_FS_OFFSET;
  iVar2 = snprintf((char *)(lVar1 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                   (ulong)*(uint *)((long)&err_code_s::NameMap.Arr[0].Name.Size + lVar4),
                   *(undefined8 *)((long)&err_code_s::NameMap.Arr[0].Name.field_0 + lVar4),
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
                   ,uVar6);
  snprintf((char *)(lVar1 + -0xf80) + iVar2,0x400 - (long)iVar2,"%s",FileName);
  if (__s == (FILE *)0x0) goto LAB_0019bf02;
  goto LAB_0019befa;
code_r0x0019be37:
  lVar4 = lVar4 + 0x18;
  if (lVar4 == 0x1f8) goto LAB_0019be43;
  goto LAB_0019be31;
}

Assistant:

error<>
WriteBuffer(cstr FileName, const buffer& Buf)
{
  idx2_Assert(Buf.Data && Buf.Bytes);

  FILE* Fp = fopen(FileName, "wb");
  idx2_CleanUp(if (Fp) fclose(Fp));
  if (!Fp)
    return idx2_Error(err_code::FileCreateFailed, "%s", FileName);

  /* Read file contents */
  if (fwrite(Buf.Data, size_t(Buf.Bytes), 1, Fp) != 1)
    return idx2_Error(err_code::FileWriteFailed, "%s", FileName);
  return idx2_Error(err_code::NoError);
}